

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_24::CSharpCodeGenerator::GenerateMakeRule
          (CSharpCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  string local_30;
  
  JavaCSharpMakeRule(&local_30,false,parser,path,filename);
  std::__cxx11::string::operator=((string *)output,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = JavaCSharpMakeRule(false, parser, path, filename);
    return Status::OK;
  }